

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,string *value,string *url)

{
  ostream *stream;
  TD td;
  CENTER center;
  TR tr;
  undefined1 auStack_548 [432];
  ostream *local_398;
  TAG local_390;
  TAG local_1d8;
  
  stream = (ostream *)(s + 0x10);
  HTML::TR::TR((TR *)&local_1d8,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_1d8.m_stream,">",1);
  HTML::TD::TD((TD *)auStack_548,stream);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(auStack_548 + 0x38),(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(local_398,">",1);
  HTML::TAG::~TAG((TAG *)auStack_548);
  HTML::TD::TD((TD *)auStack_548,stream);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(auStack_548 + 0x38),(value->_M_dataplus)._M_p,value->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(local_398,">",1);
  HTML::TAG::~TAG((TAG *)auStack_548);
  HTML::TD::TD((TD *)auStack_548,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_398,">",1);
  HTML::CENTER::CENTER((CENTER *)&local_390,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_390.m_stream,">",1);
  HTML::TAG::~TAG(&local_390);
  HTML::TAG::~TAG((TAG *)auStack_548);
  HTML::TAG::~TAG(&local_1d8);
  return;
}

Assistant:

void HttpConnection::showRow(
    std::stringstream &s,
    const std::string &name,
    const std::string &value,
    const std::string &url) {
  {
    TR tr(s);
    tr.text();
    {
      TD td(s);
      td.text(name);
    }
    {
      TD td(s);
      td.text(value);
    }
    {
      TD td(s);
      td.text();
      CENTER center(s);
      center.text();
    }
  }
}